

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,bool>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  Value *pVVar4;
  LogicalType *type;
  ulong uVar5;
  long lVar6;
  idx_t iVar7;
  idx_t iVar8;
  long lVar9;
  long lVar10;
  vector<bool,_std::allocator<bool>_> *this;
  idx_t bin_idx;
  ulong uVar11;
  ulong uVar12;
  reference rVar13;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  duckdb local_70 [64];
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  pVVar4 = (Value *)duckdb::ListVector::GetListSize(result);
  type = (LogicalType *)duckdb::MapType::KeyType((LogicalType *)(result + 8));
  bVar3 = SupportsOtherBucket(type);
  lVar9 = 0;
  for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
    iVar8 = iVar7;
    if (*local_b8 != 0) {
      iVar8 = (idx_t)*(uint *)(*local_b8 + iVar7 * 4);
    }
    plVar1 = *(long **)(local_b0 + iVar8 * 8);
    plVar2 = (long *)*plVar1;
    if (plVar2 != (long *)0x0) {
      lVar9 = (ulong)(*(long *)(*(long *)(plVar1[1] + 8) + -8) != 0 && bVar3) +
              lVar9 + (ulong)*(uint *)(plVar2 + 3) + (plVar2[2] - *plVar2) * 8;
    }
  }
  duckdb::ListVector::Reserve(result,(ulong)(pVVar4 + lVar9));
  uVar5 = duckdb::MapVector::GetKeys(result);
  lVar6 = duckdb::MapVector::GetValues(result);
  lVar9 = *(long *)(result + 0x20);
  lVar6 = *(long *)(lVar6 + 0x20);
  for (uVar12 = 0; uVar12 != count; uVar12 = uVar12 + 1) {
    uVar11 = uVar12;
    if (*local_b8 != 0) {
      uVar11 = (ulong)*(uint *)(*local_b8 + uVar12 * 4);
    }
    plVar1 = *(long **)(local_b0 + uVar11 * 8);
    this = (vector<bool,_std::allocator<bool>_> *)*plVar1;
    if (this == (vector<bool,_std::allocator<bool>_> *)0x0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),uVar12 + offset);
    }
    else {
      lVar10 = (uVar12 + offset) * 0x10;
      plVar2 = (long *)(lVar9 + lVar10);
      *(Value **)(lVar9 + lVar10) = pVVar4;
      for (uVar11 = 0;
          uVar11 < (ulong)(this->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)(this->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   (long)(this->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
          uVar11 = uVar11 + 1) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](this,uVar11);
        pVVar4[*(long *)(uVar5 + 0x20)] = (Value)((*rVar13._M_p & rVar13._M_mask) != 0);
        *(undefined8 *)(lVar6 + (long)pVVar4 * 8) = *(undefined8 *)(*(long *)plVar1[1] + uVar11 * 8)
        ;
        pVVar4 = pVVar4 + 1;
        this = (vector<bool,_std::allocator<bool>_> *)*plVar1;
      }
      if (bVar3 && *(long *)(*(long *)(plVar1[1] + 8) + -8) != 0) {
        OtherBucketValue(local_70,(LogicalType *)(uVar5 + 8));
        duckdb::Vector::SetValue(uVar5,pVVar4);
        duckdb::Value::~Value((Value *)local_70);
        *(undefined8 *)(lVar6 + (long)pVVar4 * 8) = *(undefined8 *)(*(long *)(plVar1[1] + 8) + -8);
        pVVar4 = pVVar4 + 1;
      }
      plVar2[1] = (long)pVVar4 - *plVar2;
    }
  }
  duckdb::ListVector::SetListSize(result,(ulong)pVVar4);
  duckdb::Vector::Verify((ulong)result);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}